

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateMouseWheel(void)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  ImVec2 IVar6;
  float scroll_step_1;
  float max_step_1;
  float scroll_step;
  float max_step;
  float wheel_x;
  float wheel_y;
  bool swap_axis;
  ImVec2 offset;
  float scale;
  float new_font_scale;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffff48;
  float local_a4;
  float local_a0;
  ImGuiCond in_stack_ffffffffffffff64;
  ImGuiWindow *pos;
  ImGuiWindow *window_00;
  ImGuiWindow *local_18;
  ImVec2 local_10;
  ImGuiContext *local_8;
  
  local_8 = GImGui;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    bVar2 = IsMousePosValid((ImVec2 *)0x0);
    bVar3 = false;
    if (bVar2) {
      local_10 = operator-(in_stack_ffffffffffffff48,(ImVec2 *)0x11f12b);
      fVar4 = ImLengthSqr(&local_10);
      bVar3 = (local_8->IO).MouseDragThreshold * (local_8->IO).MouseDragThreshold < fVar4;
    }
    if (bVar3) {
      local_8->WheelingWindowTimer = 0.0;
    }
    if (local_8->WheelingWindowTimer <= 0.0) {
      local_8->WheelingWindow = (ImGuiWindow *)0x0;
      local_8->WheelingWindowTimer = 0.0;
    }
  }
  fVar4 = (local_8->IO).MouseWheel;
  if (((((fVar4 != 0.0) || (NAN(fVar4))) || (fVar4 = (local_8->IO).MouseWheelH, fVar4 != 0.0)) ||
      (NAN(fVar4))) &&
     (((local_8->ActiveId == 0 || ((local_8->ActiveIdUsingMouseWheel & 1U) == 0)) &&
      ((local_8->HoveredIdPreviousFrame == 0 ||
       ((local_8->HoveredIdPreviousFrameUsingMouseWheel & 1U) == 0)))))) {
    if (local_8->WheelingWindow == (ImGuiWindow *)0x0) {
      local_18 = local_8->HoveredWindow;
    }
    else {
      local_18 = local_8->WheelingWindow;
    }
    if ((local_18 != (ImGuiWindow *)0x0) && ((local_18->Collapsed & 1U) == 0)) {
      fVar4 = (local_8->IO).MouseWheel;
      if (((fVar4 == 0.0) && (!NAN(fVar4))) ||
         ((((local_8->IO).KeyCtrl & 1U) == 0 || (((local_8->IO).FontAllowUserScaling & 1U) == 0))))
      {
        if (((local_8->IO).KeyCtrl & 1U) == 0) {
          bVar1 = 0;
          if (((local_8->IO).KeyShift & 1U) != 0) {
            bVar1 = (local_8->IO).ConfigMacOSXBehaviors ^ 0xff;
          }
          if ((bVar1 & 1) == 0) {
            local_a0 = (local_8->IO).MouseWheel;
          }
          else {
            local_a0 = 0.0;
          }
          if ((bVar1 & 1) == 0) {
            local_a4 = (local_8->IO).MouseWheelH;
          }
          else {
            local_a4 = (local_8->IO).MouseWheel;
          }
          if ((local_a0 != 0.0) || (NAN(local_a0))) {
            StartLockWheelingWindow(local_18);
            while( true ) {
              bVar3 = false;
              if ((local_18->Flags & 0x1000000U) != 0) {
                fVar4 = (local_18->ScrollMax).y;
                bVar3 = true;
                if (((fVar4 != 0.0) || (NAN(fVar4))) &&
                   (bVar3 = false, (local_18->Flags & 0x10U) != 0)) {
                  bVar3 = (local_18->Flags & 0x200U) == 0;
                }
              }
              if (!bVar3) break;
              local_18 = local_18->ParentWindow;
            }
            if (((local_18->Flags & 0x10U) == 0) && ((local_18->Flags & 0x200U) == 0)) {
              fVar4 = ImRect::GetHeight(&local_18->InnerRect);
              fVar5 = ImGuiWindow::CalcFontSize(local_18);
              fVar4 = ImMin<float>(fVar5 * 5.0,fVar4 * 0.67);
              fVar4 = ImFloor(fVar4);
              SetScrollY(local_18,-local_a0 * fVar4 + (local_18->Scroll).y);
            }
          }
          if ((local_a4 != 0.0) || (NAN(local_a4))) {
            StartLockWheelingWindow(local_18);
            while( true ) {
              bVar3 = false;
              if ((local_18->Flags & 0x1000000U) != 0) {
                fVar4 = (local_18->ScrollMax).x;
                bVar3 = true;
                if (((fVar4 != 0.0) || (NAN(fVar4))) &&
                   (bVar3 = false, (local_18->Flags & 0x10U) != 0)) {
                  bVar3 = (local_18->Flags & 0x200U) == 0;
                }
              }
              if (!bVar3) break;
              local_18 = local_18->ParentWindow;
            }
            if (((local_18->Flags & 0x10U) == 0) && ((local_18->Flags & 0x200U) == 0)) {
              fVar4 = ImRect::GetWidth(&local_18->InnerRect);
              fVar5 = ImGuiWindow::CalcFontSize(local_18);
              fVar4 = ImMin<float>(fVar5 * 2.0,fVar4 * 0.67);
              fVar4 = ImFloor(fVar4);
              SetScrollX(local_18,-local_a4 * fVar4 + (local_18->Scroll).x);
            }
          }
        }
      }
      else {
        window_00 = local_18;
        StartLockWheelingWindow(local_18);
        fVar4 = ImClamp<float>((local_8->IO).MouseWheel * 0.1 + local_18->FontWindowScale,0.5,2.5);
        local_18->FontWindowScale = fVar4;
        if (local_18 == local_18->RootWindow) {
          operator*(in_stack_ffffffffffffff48,0.0);
          operator-(in_stack_ffffffffffffff48,(ImVec2 *)0x11f3f2);
          operator*(in_stack_ffffffffffffff48,(ImVec2 *)0x11f40a);
          operator/(in_stack_ffffffffffffff48,(ImVec2 *)0x11f42c);
          pos = local_18;
          operator+(in_stack_ffffffffffffff48,(ImVec2 *)0x11f453);
          SetWindowPos(window_00,(ImVec2 *)pos,in_stack_ffffffffffffff64);
          operator*(in_stack_ffffffffffffff48,0.0);
          IVar6 = ImFloor(in_stack_ffffffffffffff48);
          local_18->Size = IVar6;
          operator*(in_stack_ffffffffffffff48,0.0);
          IVar6 = ImFloor(in_stack_ffffffffffffff48);
          local_18->SizeFull = IVar6;
        }
      }
    }
  }
  return;
}

Assistant:

void ImGui::UpdateMouseWheel()
{
    ImGuiContext& g = *GImGui;

    // Reset the locked window if we move the mouse or after the timer elapses
    if (g.WheelingWindow != NULL)
    {
        g.WheelingWindowTimer -= g.IO.DeltaTime;
        if (IsMousePosValid() && ImLengthSqr(g.IO.MousePos - g.WheelingWindowRefMousePos) > g.IO.MouseDragThreshold * g.IO.MouseDragThreshold)
            g.WheelingWindowTimer = 0.0f;
        if (g.WheelingWindowTimer <= 0.0f)
        {
            g.WheelingWindow = NULL;
            g.WheelingWindowTimer = 0.0f;
        }
    }

    if (g.IO.MouseWheel == 0.0f && g.IO.MouseWheelH == 0.0f)
        return;

    if ((g.ActiveId != 0 && g.ActiveIdUsingMouseWheel) || (g.HoveredIdPreviousFrame != 0 && g.HoveredIdPreviousFrameUsingMouseWheel))
        return;

    ImGuiWindow* window = g.WheelingWindow ? g.WheelingWindow : g.HoveredWindow;
    if (!window || window->Collapsed)
        return;

    // Zoom / Scale window
    // FIXME-OBSOLETE: This is an old feature, it still works but pretty much nobody is using it and may be best redesigned.
    if (g.IO.MouseWheel != 0.0f && g.IO.KeyCtrl && g.IO.FontAllowUserScaling)
    {
        StartLockWheelingWindow(window);
        const float new_font_scale = ImClamp(window->FontWindowScale + g.IO.MouseWheel * 0.10f, 0.50f, 2.50f);
        const float scale = new_font_scale / window->FontWindowScale;
        window->FontWindowScale = new_font_scale;
        if (window == window->RootWindow)
        {
            const ImVec2 offset = window->Size * (1.0f - scale) * (g.IO.MousePos - window->Pos) / window->Size;
            SetWindowPos(window, window->Pos + offset, 0);
            window->Size = ImFloor(window->Size * scale);
            window->SizeFull = ImFloor(window->SizeFull * scale);
        }
        return;
    }

    // Mouse wheel scrolling
    // If a child window has the ImGuiWindowFlags_NoScrollWithMouse flag, we give a chance to scroll its parent
    if (g.IO.KeyCtrl)
        return;

    // As a standard behavior holding SHIFT while using Vertical Mouse Wheel triggers Horizontal scroll instead
    // (we avoid doing it on OSX as it the OS input layer handles this already)
    const bool swap_axis = g.IO.KeyShift && !g.IO.ConfigMacOSXBehaviors;
    const float wheel_y = swap_axis ? 0.0f : g.IO.MouseWheel;
    const float wheel_x = swap_axis ? g.IO.MouseWheel : g.IO.MouseWheelH;

    // Vertical Mouse Wheel scrolling
    if (wheel_y != 0.0f)
    {
        StartLockWheelingWindow(window);
        while ((window->Flags & ImGuiWindowFlags_ChildWindow) && ((window->ScrollMax.y == 0.0f) || ((window->Flags & ImGuiWindowFlags_NoScrollWithMouse) && !(window->Flags & ImGuiWindowFlags_NoMouseInputs))))
            window = window->ParentWindow;
        if (!(window->Flags & ImGuiWindowFlags_NoScrollWithMouse) && !(window->Flags & ImGuiWindowFlags_NoMouseInputs))
        {
            float max_step = window->InnerRect.GetHeight() * 0.67f;
            float scroll_step = ImFloor(ImMin(5 * window->CalcFontSize(), max_step));
            SetScrollY(window, window->Scroll.y - wheel_y * scroll_step);
        }
    }

    // Horizontal Mouse Wheel scrolling, or Vertical Mouse Wheel w/ Shift held
    if (wheel_x != 0.0f)
    {
        StartLockWheelingWindow(window);
        while ((window->Flags & ImGuiWindowFlags_ChildWindow) && ((window->ScrollMax.x == 0.0f) || ((window->Flags & ImGuiWindowFlags_NoScrollWithMouse) && !(window->Flags & ImGuiWindowFlags_NoMouseInputs))))
            window = window->ParentWindow;
        if (!(window->Flags & ImGuiWindowFlags_NoScrollWithMouse) && !(window->Flags & ImGuiWindowFlags_NoMouseInputs))
        {
            float max_step = window->InnerRect.GetWidth() * 0.67f;
            float scroll_step = ImFloor(ImMin(2 * window->CalcFontSize(), max_step));
            SetScrollX(window, window->Scroll.x - wheel_x * scroll_step);
        }
    }
}